

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void filterScanline(uchar *out,uchar *scanline,uchar *prevline,size_t length,size_t bytewidth,
                   uchar filterType)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000089;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  
  switch(CONCAT71(in_register_00000089,filterType) & 0xffffffff) {
  case 0:
    if (length != 0) {
      sVar2 = 0;
      do {
        out[sVar2] = scanline[sVar2];
        sVar2 = sVar2 + 1;
      } while (length != sVar2);
    }
    break;
  case 1:
    if (bytewidth != 0) {
      sVar2 = 0;
      do {
        out[sVar2] = scanline[sVar2];
        sVar2 = sVar2 + 1;
      } while (bytewidth != sVar2);
    }
    if (bytewidth < length) {
      lVar3 = 0;
      do {
        out[lVar3 + bytewidth] = scanline[lVar3 + bytewidth] - scanline[lVar3];
        lVar3 = lVar3 + 1;
      } while (length - bytewidth != lVar3);
    }
    break;
  case 2:
    if (prevline == (uchar *)0x0) {
      if (length != 0) {
        sVar2 = 0;
        do {
          out[sVar2] = scanline[sVar2];
          sVar2 = sVar2 + 1;
        } while (length != sVar2);
      }
    }
    else if (length != 0) {
      sVar2 = 0;
      do {
        out[sVar2] = scanline[sVar2] - prevline[sVar2];
        sVar2 = sVar2 + 1;
      } while (length != sVar2);
    }
    break;
  case 3:
    if (prevline == (uchar *)0x0) {
      if (bytewidth != 0) {
        sVar2 = 0;
        do {
          out[sVar2] = scanline[sVar2];
          sVar2 = sVar2 + 1;
        } while (bytewidth != sVar2);
      }
      if (bytewidth < length) {
        lVar3 = 0;
        do {
          out[lVar3 + bytewidth] = scanline[lVar3 + bytewidth] - (scanline[lVar3] >> 1);
          lVar3 = lVar3 + 1;
        } while (length - bytewidth != lVar3);
      }
    }
    else {
      if (bytewidth != 0) {
        sVar2 = 0;
        do {
          out[sVar2] = scanline[sVar2] - (prevline[sVar2] >> 1);
          sVar2 = sVar2 + 1;
        } while (bytewidth != sVar2);
      }
      if (bytewidth < length) {
        lVar3 = 0;
        do {
          out[lVar3 + bytewidth] =
               scanline[lVar3 + bytewidth] -
               (char)((uint)prevline[lVar3 + bytewidth] + (uint)scanline[lVar3] >> 1);
          lVar3 = lVar3 + 1;
        } while (length - bytewidth != lVar3);
      }
    }
    break;
  case 4:
    if (prevline == (uchar *)0x0) {
      if (bytewidth != 0) {
        sVar2 = 0;
        do {
          out[sVar2] = scanline[sVar2];
          sVar2 = sVar2 + 1;
        } while (bytewidth != sVar2);
      }
      if (bytewidth < length) {
        lVar3 = 0;
        do {
          out[lVar3 + bytewidth] = scanline[lVar3 + bytewidth] - scanline[lVar3];
          lVar3 = lVar3 + 1;
        } while (length - bytewidth != lVar3);
      }
    }
    else {
      if (bytewidth != 0) {
        sVar2 = 0;
        do {
          out[sVar2] = scanline[sVar2] - prevline[sVar2];
          sVar2 = sVar2 + 1;
        } while (bytewidth != sVar2);
      }
      if (bytewidth < length) {
        lVar3 = 0;
        do {
          bVar1 = scanline[lVar3];
          bVar7 = prevline[bytewidth];
          bVar6 = prevline[lVar3];
          uVar5 = (uint)bVar7 - (uint)bVar6;
          uVar4 = -uVar5;
          if (0 < (int)uVar5) {
            uVar4 = uVar5;
          }
          uVar9 = (uint)bVar1 - (uint)bVar6;
          uVar5 = -uVar9;
          if (0 < (int)uVar9) {
            uVar5 = uVar9;
          }
          uVar8 = (uint)bVar7 + (uint)bVar1 + (uint)bVar6 * -2;
          uVar9 = -uVar8;
          if (0 < (int)uVar8) {
            uVar9 = uVar8;
          }
          if ((uVar4 & 0xff) <= (uVar5 & 0xff)) {
            bVar7 = bVar1;
          }
          if ((uVar5 & 0xff) <= uVar9) {
            bVar6 = bVar7;
          }
          if ((uVar4 & 0xff) <= uVar9) {
            bVar6 = bVar7;
          }
          out[bytewidth] = scanline[bytewidth] - bVar6;
          bytewidth = bytewidth + 1;
          lVar3 = lVar3 + 1;
        } while (length != bytewidth);
        return;
      }
    }
  }
  return;
}

Assistant:

static void filterScanline(unsigned char* out, const unsigned char* scanline, const unsigned char* prevline,
                           size_t length, size_t bytewidth, unsigned char filterType)
{
  size_t i;
  switch(filterType)
  {
    case 0: /*None*/
      for(i = 0; i != length; ++i) out[i] = scanline[i];
      break;
    case 1: /*Sub*/
      for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - scanline[i - bytewidth];
      break;
    case 2: /*Up*/
      if(prevline)
      {
        for(i = 0; i != length; ++i) out[i] = scanline[i] - prevline[i];
      }
      else
      {
        for(i = 0; i != length; ++i) out[i] = scanline[i];
      }
      break;
    case 3: /*Average*/
      if(prevline)
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i] - (prevline[i] >> 1);
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - ((scanline[i - bytewidth] + prevline[i]) >> 1);
      }
      else
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - (scanline[i - bytewidth] >> 1);
      }
      break;
    case 4: /*Paeth*/
      if(prevline)
      {
        /*paethPredictor(0, prevline[i], 0) is always prevline[i]*/
        for(i = 0; i != bytewidth; ++i) out[i] = (scanline[i] - prevline[i]);
        for(i = bytewidth; i < length; ++i)
        {
          out[i] = (scanline[i] - paethPredictor(scanline[i - bytewidth], prevline[i], prevline[i - bytewidth]));
        }
      }
      else
      {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        /*paethPredictor(scanline[i - bytewidth], 0, 0) is always scanline[i - bytewidth]*/
        for(i = bytewidth; i < length; ++i) out[i] = (scanline[i] - scanline[i - bytewidth]);
      }
      break;
    default: return; /*unexisting filter type given*/
  }
}